

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O3

void nonce_load_hex(uint8_t *nonce,char *hex)

{
  int iVar1;
  size_t sVar2;
  
  if ((nonce != (uint8_t *)0x0) && (hex != (char *)0x0)) {
    sVar2 = strlen(hex);
    if (sVar2 == 0x30) {
      iVar1 = sodium_hex2bin(nonce,0x18,hex,0x30,0,0,0);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00101592;
    }
  }
  nonce_load_hex_cold_1();
LAB_00101592:
  __assert_fail("sodium_hex2bin(nonce, paseto_v2_LOCAL_NONCEBYTES, hex, strlen(hex), NULL, NULL, NULL) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/helpers.c"
                ,0x11,"void nonce_load_hex(uint8_t *, const char *)");
}

Assistant:

void nonce_load_hex(
        uint8_t nonce[paseto_v2_LOCAL_NONCEBYTES], const char *hex) {
    if (!nonce || !hex || strlen(hex) != 2 * paseto_v2_LOCAL_NONCEBYTES) {
        fprintf(stderr, "nonce_load_hex called with invalid hex string length "
                        "or null pointer");
        abort();
    }
    assert(sodium_hex2bin(nonce, paseto_v2_LOCAL_NONCEBYTES, hex, strlen(hex),
            NULL, NULL, NULL) == 0);
}